

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.c
# Opt level: O3

dtl_av_t * apx_vm_deserializer_take_av(apx_vm_deserializer_t *self)

{
  apx_vm_readState_t *paVar1;
  dtl_av_t *pdVar2;
  
  if ((self != (apx_vm_deserializer_t *)0x0) &&
     (paVar1 = self->state, paVar1->value_type == DTL_DV_ARRAY)) {
    pdVar2 = (dtl_av_t *)(paVar1->value).sv;
    paVar1->value_type = DTL_DV_NULL;
    (paVar1->value).sv = (dtl_sv_t *)0x0;
    return pdVar2;
  }
  return (dtl_av_t *)0x0;
}

Assistant:

dtl_av_t* apx_vm_deserializer_take_av(apx_vm_deserializer_t* self)
{
   if ((self != NULL) && (self->state->value_type == DTL_DV_ARRAY))
   {
      dtl_av_t* retval = self->state->value.av;
      self->state->value_type = DTL_DV_NULL;
      self->state->value.dv = NULL;
      return retval;
   }
   return NULL;
}